

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O0

int lgx_co_resume(lgx_vm_t *vm,lgx_co_t *co)

{
  int iVar1;
  lgx_co_t *co_local;
  lgx_vm_t *vm_local;
  
  if (co->status == CO_SUSPEND) {
    iVar1 = lgx_list_empty(&co->head);
    if (iVar1 == 0) {
      lgx_list_del(&co->head);
    }
    (co->head).next = &co->head;
    (co->head).prev = &co->head;
    co->child = (lgx_co_s *)0x0;
    co->status = CO_READY;
    lgx_list_add_tail(&co->head,&vm->co_ready);
    if (vm->co_running == (lgx_co_t *)0x0) {
      vm_local._4_4_ = lgx_co_run(vm,co);
    }
    else {
      vm_local._4_4_ = 0;
    }
    return vm_local._4_4_;
  }
  __assert_fail("co->status == CO_SUSPEND",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/interpreter/coroutine.c"
                ,0xbb,"int lgx_co_resume(lgx_vm_t *, lgx_co_t *)");
}

Assistant:

int lgx_co_resume(lgx_vm_t *vm, lgx_co_t *co) {
    assert(co->status == CO_SUSPEND);

    if (!lgx_list_empty(&co->head)) {
        lgx_list_del(&co->head);
    }
    lgx_list_init(&co->head);

    co->child = NULL;
    co->status = CO_READY;

    lgx_list_add_tail(&co->head, &vm->co_ready);

    if (vm->co_running) {
        return 0;
    } else {
        return lgx_co_run(vm, co);
    }
}